

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::move(QTextDocumentPrivate *this,int pos,int to,int length,Operation op)

{
  long lVar1;
  uint f;
  uint uVar2;
  uint uVar3;
  uint pos_00;
  uint length_00;
  uint format;
  Operation op_00;
  int command;
  uint uVar4;
  uint uVar5;
  QTextBlockData *pQVar6;
  Operation in_ECX;
  int in_EDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  Operation in_R8D;
  long in_FS_OFFSET;
  bool bVar7;
  QTextFragmentData *X;
  int blockRevision;
  QTextBlockData *B;
  uint b;
  uint key;
  uint n;
  uint w;
  uint end;
  uint x;
  uint dstKey;
  uint dst;
  bool needsInsert;
  QTextUndoCommand cInsert;
  QTextUndoCommand c;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  QFragmentMap<QTextBlockData> *in_stack_ffffffffffffff40;
  QTextDocumentPrivate *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff78;
  uint uVar8;
  QTextDocumentPrivate *pQVar9;
  QTextDocumentPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI != in_EDX) {
    bVar7 = in_EDX != -1;
    pQVar9 = in_RDI;
    split((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    split((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (bVar7) {
      f = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      uVar2 = QFragmentMap<QTextFragmentData>::position
                        ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    }
    else {
      f = 0;
      uVar2 = 0;
    }
    uVar5 = uVar2;
    uVar3 = QFragmentMap<QTextFragmentData>::findNode
                      ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    pos_00 = QFragmentMap<QTextFragmentData>::findNode
                       ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    uVar8 = 0;
    while (uVar3 != pos_00) {
      length_00 = QFragmentMap<QTextFragmentData>::next
                            ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff3c);
      format = QFragmentMap<QTextFragmentData>::position
                         ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      op_00 = QFragmentMap<QTextBlockData>::findNode
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
      pQVar6 = QFragmentMap<QTextBlockData>::fragment
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      command = (*(int *)&pQVar6->field_0x44 << 1) >> 1;
      in_stack_ffffffffffffff60 =
           (QTextDocumentPrivate *)
           QFragmentMap<QTextFragmentData>::fragment
                     ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff3c);
      this_00 = (QTextDocumentPrivate *)
                ((ulong)CONCAT42(*(int *)&in_stack_ffffffffffffff60->field_0x1c,
                                 CONCAT11((char)in_R8D,in_RDI->editBlock != 0)) << 0x10);
      uVar8 = format + 1;
      uVar4 = QFragmentMap<QTextBlockData>::position
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
      if (uVar8 == uVar4) {
        QFragmentMap<QTextBlockData>::previous(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        pQVar6 = (QTextBlockData *)0x0;
        QFragmentMap<QTextBlockData>::size
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        uVar8 = remove_block(this_00,(int)((ulong)pQVar9 >> 0x20),(int *)CONCAT44(in_ESI,in_EDX),
                             in_ECX,in_R8D);
        if (bVar7) {
          uVar5 = uVar5 + 1;
          in_stack_ffffffffffffff38 = 5;
          insert_block(this_00,(int)((ulong)pQVar9 >> 0x20),(uint)pQVar9,in_ESI,in_EDX,in_ECX,
                       command);
          QFragmentMap<QTextBlockData>::size
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        }
      }
      else {
        uVar8 = remove_string((QTextDocumentPrivate *)CONCAT44(length_00,format),op_00,
                              in_stack_ffffffffffffff78,(Operation)((ulong)pQVar6 >> 0x20));
        if (bVar7) {
          insert_string((QTextDocumentPrivate *)CONCAT44(uVar5,uVar3),pos_00,uVar8,length_00,format,
                        op_00);
          uVar5 = *(quint32 *)&in_stack_ffffffffffffff60->field_0x14 + uVar5;
        }
      }
      appendUndoItem(in_RDI,(QTextUndoCommand *)CONCAT44(f,uVar2));
      if (pQVar6 != (QTextBlockData *)0x0) {
        *(uint *)&pQVar6->field_0x44 =
             *(uint *)&pQVar6->field_0x44 & 0x80000000 | in_RDI->revision & 0x7fffffffU;
      }
      uVar3 = length_00;
      if (bVar7) {
        appendUndoItem(in_RDI,(QTextUndoCommand *)CONCAT44(f,uVar2));
        uVar3 = length_00;
      }
    }
    if (uVar8 != 0) {
      unite(in_RDI,f);
    }
    if (((byte)in_RDI->field_0x294 >> 1 & 1) == 0) {
      finishEdit(in_stack_ffffffffffffff60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::move(int pos, int to, int length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(to <= fragments.length() && to <= pos);
    Q_ASSERT(pos >= 0 && pos+length <= fragments.length());
    Q_ASSERT(blocks.length() == fragments.length());

    if (pos == to)
        return;

    const bool needsInsert = to != -1;

#if !defined(QT_NO_DEBUG)
    const bool startAndEndInSameFrame = (frameAt(pos) == frameAt(pos + length - 1));

    const bool endIsEndOfChildFrame = (isAncestorFrame(frameAt(pos), frameAt(pos + length - 1))
                                       && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame);

    const bool startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent
               = (text.at(find(pos)->stringPosition) == QTextBeginningOfFrame
                  && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame
                  && frameAt(pos)->parentFrame() == frameAt(pos + length - 1)->parentFrame());

    const bool isFirstTableCell = (qobject_cast<QTextTable *>(frameAt(pos + length - 1))
                                  && frameAt(pos + length - 1)->parentFrame() == frameAt(pos));

    Q_ASSERT(startAndEndInSameFrame || endIsEndOfChildFrame || startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent || isFirstTableCell);
#endif

    split(pos);
    split(pos+length);

    uint dst = needsInsert ? fragments.findNode(to) : 0;
    uint dstKey = needsInsert ? fragments.position(dst) : 0;

    uint x = fragments.findNode(pos);
    uint end = fragments.findNode(pos+length);

    uint w = 0;
    while (x != end) {
        uint n = fragments.next(x);

        uint key = fragments.position(x);
        uint b = blocks.findNode(key+1);
        QTextBlockData *B = blocks.fragment(b);
        int blockRevision = B->revision;

        QTextFragmentData *X = fragments.fragment(x);
        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::Removed, (editBlock != 0),
                                op, X->format, X->stringPosition, key, X->size_array[0],
                                blockRevision);
        QT_INIT_TEXTUNDOCOMMAND(cInsert, QTextUndoCommand::Inserted, (editBlock != 0),
                                op, X->format, X->stringPosition, dstKey, X->size_array[0],
                                blockRevision);

        if (key+1 != blocks.position(b)) {
//          qDebug("remove_string from %d length %d", key, X->size_array[0]);
            Q_ASSERT(noBlockInString(QStringView{text}.mid(X->stringPosition, X->size_array[0])));
            w = remove_string(key, X->size_array[0], op);

            if (needsInsert) {
                insert_string(dstKey, X->stringPosition, X->size_array[0], X->format, op);
                dstKey += X->size_array[0];
            }
        } else {
//          qDebug("remove_block at %d", key);
            Q_ASSERT(X->size_array[0] == 1 && isValidBlockSeparator(text.at(X->stringPosition)));
            b = blocks.previous(b);
            B = nullptr;
            c.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockDeleted : QTextUndoCommand::BlockRemoved;
            w = remove_block(key, &c.blockFormat, QTextUndoCommand::BlockAdded, op);

            if (needsInsert) {
                insert_block(dstKey++, X->stringPosition, X->format, c.blockFormat, op, QTextUndoCommand::BlockRemoved);
                cInsert.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockAdded : QTextUndoCommand::BlockInserted;
                cInsert.blockFormat = c.blockFormat;
            }
        }
        appendUndoItem(c);
        if (B)
            B->revision = revision;
        x = n;

        if (needsInsert)
            appendUndoItem(cInsert);
    }
    if (w)
        unite(w);

    Q_ASSERT(blocks.length() == fragments.length());

    if (!blockCursorAdjustment)
        finishEdit();
}